

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcode.c
# Opt level: O0

void addcharset(CompileState *compst,byte *cs)

{
  int iVar1;
  int local_24;
  int local_20;
  int j;
  int i;
  int p;
  byte *cs_local;
  CompileState *compst_local;
  
  iVar1 = compst->ncode;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    nextinstruction(compst);
  }
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    compst->p->code->buff[(long)local_24 + (long)iVar1 * 4] = cs[local_24];
  }
  return;
}

Assistant:

static void addcharset (CompileState *compst, const byte *cs) {
  int p = gethere(compst);
  int i;
  for (i = 0; i < (int)CHARSETINSTSIZE - 1; i++)
    nextinstruction(compst);  /* space for buffer */
  /* fill buffer with charset */
  loopset(j, getinstr(compst, p).buff[j] = cs[j]);
}